

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::computeDualSteepestEdgeWeights(HEkk *this,bool initial)

{
  HighsSimplexAnalysis *this_00;
  uint size_;
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  HVector row_ep;
  
  this_00 = &this->analysis_;
  if ((this->analysis_).analyse_simplex_time == true) {
    HighsSimplexAnalysis::simplexTimerStart(this_00,1,0);
    HighsSimplexAnalysis::simplexTimerStart(this_00,0x1a,0);
  }
  size_ = (this->lp_).num_row_;
  row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVectorBase<double>::setup(&row_ep,size_);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)size_) {
    uVar3 = (ulong)size_;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar1 = computeDualSteepestEdgeWeight(this,(HighsInt)uVar2,&row_ep);
    (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] = dVar1;
  }
  if ((this->analysis_).analyse_simplex_time != false) {
    HighsSimplexAnalysis::simplexTimerStop(this_00,1,0);
    HighsSimplexAnalysis::simplexTimerStop(this_00,0x1a,0);
    if (initial) {
      dVar1 = HighsSimplexAnalysis::simplexTimerRead(this_00,1,0);
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kDetailed,
                  "Computed %d initial DSE weights in %gs\n",SUB84(dVar1,0),(ulong)size_);
    }
  }
  HVectorBase<double>::~HVectorBase(&row_ep);
  return;
}

Assistant:

void HEkk::computeDualSteepestEdgeWeights(const bool initial) {
  if (analysis_.analyse_simplex_time) {
    analysis_.simplexTimerStart(SimplexIzDseWtClock);
    analysis_.simplexTimerStart(DseIzClock);
  }
  const HighsInt num_row = lp_.num_row_;
  HVector row_ep;
  row_ep.setup(num_row);
  assert((HighsInt)dual_edge_weight_.size() >= num_row);
  for (HighsInt iRow = 0; iRow < num_row; iRow++)
    dual_edge_weight_[iRow] = computeDualSteepestEdgeWeight(iRow, row_ep);
  if (analysis_.analyse_simplex_time) {
    analysis_.simplexTimerStop(SimplexIzDseWtClock);
    analysis_.simplexTimerStop(DseIzClock);
    if (initial) {
      double IzDseWtTT = analysis_.simplexTimerRead(SimplexIzDseWtClock);
      highsLogDev(options_->log_options, HighsLogType::kDetailed,
                  "Computed %" HIGHSINT_FORMAT " initial DSE weights in %gs\n",
                  num_row, IzDseWtTT);
    }
  }
}